

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

SpecifyBlockSymbol *
slang::ast::SpecifyBlockSymbol::fromSyntax
          (Scope *scope,SpecifyBlockSyntax *syntax,
          SmallVector<const_slang::ast::Symbol_*,_5UL> *implicitSymbols)

{
  group_type_pointer pgVar1;
  Compilation *args;
  size_t sVar2;
  pointer ppMVar3;
  SourceLocation SVar4;
  SyntaxNode *pSVar5;
  long lVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  IdentifierNameSyntax *pIVar8;
  size_t sVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  value_type_pointer pbVar26;
  undefined8 uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  int iVar44;
  SpecifyBlockSymbol *pSVar45;
  NetType *pNVar46;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar47;
  uint uVar48;
  ulong uVar49;
  TimingCheckEventArgSyntax *eventArg;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  TransparentMemberSymbol *pTVar53;
  Symbol *args_00;
  long lVar54;
  SymbolKind *pSVar55;
  Scope *this;
  bool bVar56;
  undefined1 auVar57 [16];
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  uchar uVar70;
  uchar uVar71;
  uchar uVar72;
  uchar uVar73;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  string_view local_230;
  Scope *local_220;
  SymbolKind *local_218;
  TransparentMemberSymbol *local_210;
  size_t local_208;
  IdentifierNameSyntax *local_200;
  Compilation *local_1f8;
  NetType *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  Symbol *local_1d0;
  Compilation *local_1c8;
  size_t local_1c0;
  value_type_pointer local_1b8;
  long local_1b0;
  char *local_1a8;
  undefined1 local_1a0 [64];
  locator local_160;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  uchar uStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  uchar uStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  uchar uStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  uchar uStack_139;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  AssertionInstanceDetails *local_100;
  SourceLocation local_f8;
  Storage *local_78;
  Storage *local_70;
  undefined1 local_68 [24];
  value_type_pointer pbStack_50;
  ulong local_48;
  ulong local_40;
  
  args = scope->compilation;
  local_220 = scope;
  local_f8 = parsing::Token::location(&syntax->specify);
  local_1c8 = args;
  pSVar45 = BumpAllocator::
            emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
                      (&args->super_BumpAllocator,args,&local_f8);
  (pSVar45->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  sVar2 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppMVar3 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar51 = 0;
    do {
      Scope::addMembers(&pSVar45->super_Scope,*(SyntaxNode **)((long)ppMVar3 + lVar51));
      lVar51 = lVar51 + 8;
    } while (sVar2 << 3 != lVar51);
  }
  local_68._0_8_ = 0x3f;
  local_68._8_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x51f2f0);
  local_48 = 0;
  local_40 = 0;
  args_00 = (pSVar45->super_Scope).firstMember;
  local_78 = (Storage *)&local_f8;
  local_70 = (Storage *)&local_f8;
  this = local_220;
  do {
    if (args_00 == (Symbol *)0x0) {
      boost::unordered::detail::foa::
      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::delete_((allocator_type)local_70,
                (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)local_68);
      return pSVar45;
    }
    if (args_00->kind == SystemTimingCheck) {
      SVar4 = args_00[1].location;
      pNVar46 = Scope::getDefaultNetType(this);
      if ((SVar4 != (SourceLocation)0x0) && (pNVar46->netKind != Unknown)) {
        pSVar5 = args_00->originatingSyntax;
        local_130._8_4_ = 0xffffffff;
        local_100 = (AssertionInstanceDetails *)0x0;
        local_110 = (undefined1  [16])0x0;
        local_120 = (undefined1  [16])0x0;
        local_1a0._0_8_ = local_1a0 + 0x18;
        local_1a0._8_8_ = 0;
        local_1a0._16_8_ = 5;
        local_1f0 = pNVar46;
        local_1d0 = args_00;
        local_130._0_8_ = this;
        if ((byte *)0x1 < (byte *)((long)&(pSVar5[6].previewNode)->kind + 1)) {
          lVar54 = 0;
          lVar51 = 0;
          uVar52 = 0;
          do {
            lVar6 = *(long *)((long)SVar4 + 0x10);
            if ((ulong)(*(long *)((long)SVar4 + 0x18) - lVar6 >> 4) <= uVar52) break;
            ppSVar47 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)((long)&(pSVar5[6].parent)->kind + lVar54));
            uVar48 = *(uint *)(lVar6 + lVar51);
            if ((uVar48 < 5) && ((0x15U >> (uVar48 & 0x1f) & 1) != 0)) {
              pSVar7 = *ppSVar47;
              if (pSVar7->kind == TimingCheckEventArg) {
                Expression::findPotentiallyImplicitNets
                          (*(SyntaxNode **)(pSVar7 + 2),(ASTContext *)local_130,
                           (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_1a0
                          );
                if (pSVar7[2].parent != (SyntaxNode *)0x0) {
                  Expression::findPotentiallyImplicitNets
                            (pSVar7[2].parent[1].previewNode,(ASTContext *)local_130,
                             (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                             local_1a0);
                }
              }
              else if (pSVar7->kind == ExpressionTimingCheckArg) {
                Expression::findPotentiallyImplicitNets
                          (*(SyntaxNode **)(pSVar7 + 1),(ASTContext *)local_130,
                           (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_1a0
                          );
              }
            }
            uVar52 = uVar52 + 1;
            lVar51 = lVar51 + 0x10;
            lVar54 = lVar54 + 0x30;
          } while (uVar52 < (ulong)((long)&(pSVar5[6].previewNode)->kind + 1) >> 1);
        }
        if (local_1a0._8_8_ != 0) {
          local_1f8 = *(Compilation **)local_130._0_8_;
          pSVar55 = &((Symbol *)local_1a0._0_8_)->kind + local_1a0._8_8_ * 2;
          pTVar53 = (TransparentMemberSymbol *)local_1a0._0_8_;
          local_218 = pSVar55;
          do {
            pIVar8 = *(IdentifierNameSyntax **)&pTVar53->super_Symbol;
            local_230 = parsing::Token::valueText(&pIVar8->identifier);
            local_200 = pIVar8;
            local_208 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&local_70,&local_230);
            uVar50 = local_208 >> (local_68[0] & 0x3f);
            uVar27 = local_68._16_8_;
            lVar51 = (local_208 & 0xff) * 4;
            uVar58 = (&UNK_0051f39c)[lVar51];
            uVar59 = (&UNK_0051f39d)[lVar51];
            uVar60 = (&UNK_0051f39e)[lVar51];
            uVar61 = (&UNK_0051f39f)[lVar51];
            local_1b8 = pbStack_50;
            sVar2 = local_230._M_len;
            local_1a8 = local_230._M_str;
            uVar52 = (ulong)((uint)local_208 & 7);
            local_1e0 = local_68._8_8_;
            uVar49 = 0;
            uVar62 = uVar58;
            uVar63 = uVar59;
            uVar64 = uVar60;
            uVar65 = uVar61;
            uVar66 = uVar58;
            uVar67 = uVar59;
            uVar68 = uVar60;
            uVar69 = uVar61;
            uVar70 = uVar58;
            uVar71 = uVar59;
            uVar72 = uVar60;
            uVar73 = uVar61;
            local_1c0 = uVar50;
            do {
              pbVar26 = local_1b8;
              local_1b0 = uVar50 * 0x10;
              pgVar1 = (group_type_pointer)(uVar27 + uVar50 * 0x10);
              auVar57[0] = -(pgVar1->m[0].n == uVar58);
              auVar57[1] = -(pgVar1->m[1].n == uVar59);
              auVar57[2] = -(pgVar1->m[2].n == uVar60);
              auVar57[3] = -(pgVar1->m[3].n == uVar61);
              auVar57[4] = -(pgVar1->m[4].n == uVar62);
              auVar57[5] = -(pgVar1->m[5].n == uVar63);
              auVar57[6] = -(pgVar1->m[6].n == uVar64);
              auVar57[7] = -(pgVar1->m[7].n == uVar65);
              auVar57[8] = -(pgVar1->m[8].n == uVar66);
              auVar57[9] = -(pgVar1->m[9].n == uVar67);
              auVar57[10] = -(pgVar1->m[10].n == uVar68);
              auVar57[0xb] = -(pgVar1->m[0xb].n == uVar69);
              auVar57[0xc] = -(pgVar1->m[0xc].n == uVar70);
              auVar57[0xd] = -(pgVar1->m[0xd].n == uVar71);
              auVar57[0xe] = -(pgVar1->m[0xe].n == uVar72);
              auVar57[0xf] = -(pgVar1->m[0xf].n == uVar73);
              local_1d8 = uVar50;
              uVar28 = uVar58;
              uVar29 = uVar59;
              uVar30 = uVar60;
              uVar31 = uVar61;
              uVar32 = uVar62;
              uVar33 = uVar63;
              uVar34 = uVar64;
              uVar35 = uVar65;
              uVar36 = uVar66;
              uVar37 = uVar67;
              uVar38 = uVar68;
              uVar39 = uVar69;
              uVar40 = uVar70;
              uVar41 = uVar71;
              uVar42 = uVar72;
              uVar43 = uVar73;
              uVar10 = local_148;
              uVar11 = uStack_147;
              uVar12 = uStack_146;
              uVar13 = uStack_145;
              uVar14 = uStack_144;
              uVar15 = uStack_143;
              uVar16 = uStack_142;
              uVar17 = uStack_141;
              uVar18 = uStack_140;
              uVar19 = uStack_13f;
              uVar20 = uStack_13e;
              uVar21 = uStack_13d;
              uVar22 = uStack_13c;
              uVar23 = uStack_13b;
              uVar24 = uStack_13a;
              uVar25 = uStack_139;
              for (uVar48 = (uint)(ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe);
                  uStack_139 = uVar43, uStack_13a = uVar42, uStack_13b = uVar41, uStack_13c = uVar40
                  , uStack_13d = uVar39, uStack_13e = uVar38, uStack_13f = uVar37,
                  uStack_140 = uVar36, uStack_141 = uVar35, uStack_142 = uVar34, uStack_143 = uVar33
                  , uStack_144 = uVar32, uStack_145 = uVar31, uStack_146 = uVar30,
                  uStack_147 = uVar29, local_148 = uVar28, uVar48 != 0; uVar48 = uVar48 - 1 & uVar48
                  ) {
                iVar44 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> iVar44 & 1) == 0; iVar44 = iVar44 + 1) {
                  }
                }
                lVar51 = (long)&pbVar26[uVar50 * 0xf]._M_len + (ulong)(uint)(iVar44 << 4);
                sVar9 = *(size_t *)
                         ((long)&pbVar26[uVar50 * 0xf]._M_len + (ulong)(uint)(iVar44 << 4));
                bVar56 = sVar2 == sVar9;
                local_210 = pTVar53;
                local_1e8 = uVar52;
                if ((sVar2 != 0) && (sVar2 == sVar9)) {
                  iVar44 = bcmp(local_1a8,*(void **)(lVar51 + 8),sVar2);
                  bVar56 = iVar44 == 0;
                  uVar58 = local_148;
                  uVar59 = uStack_147;
                  uVar60 = uStack_146;
                  uVar61 = uStack_145;
                  uVar62 = uStack_144;
                  uVar63 = uStack_143;
                  uVar64 = uStack_142;
                  uVar65 = uStack_141;
                  uVar66 = uStack_140;
                  uVar67 = uStack_13f;
                  uVar68 = uStack_13e;
                  uVar69 = uStack_13d;
                  uVar70 = uStack_13c;
                  uVar71 = uStack_13b;
                  uVar72 = uStack_13a;
                  uVar73 = uStack_139;
                }
                pTVar53 = local_210;
                pSVar55 = local_218;
                if (bVar56) goto LAB_0037fa21;
                uVar52 = local_1e8;
                uVar28 = local_148;
                uVar29 = uStack_147;
                uVar30 = uStack_146;
                uVar31 = uStack_145;
                uVar32 = uStack_144;
                uVar33 = uStack_143;
                uVar34 = uStack_142;
                uVar35 = uStack_141;
                uVar36 = uStack_140;
                uVar37 = uStack_13f;
                uVar38 = uStack_13e;
                uVar39 = uStack_13d;
                uVar40 = uStack_13c;
                uVar41 = uStack_13b;
                uVar42 = uStack_13a;
                uVar43 = uStack_139;
                uVar10 = local_148;
                uVar11 = uStack_147;
                uVar12 = uStack_146;
                uVar13 = uStack_145;
                uVar14 = uStack_144;
                uVar15 = uStack_143;
                uVar16 = uStack_142;
                uVar17 = uStack_141;
                uVar18 = uStack_140;
                uVar19 = uStack_13f;
                uVar20 = uStack_13e;
                uVar21 = uStack_13d;
                uVar22 = uStack_13c;
                uVar23 = uStack_13b;
                uVar24 = uStack_13a;
                uVar25 = uStack_139;
              }
              local_148 = uVar10;
              uStack_147 = uVar11;
              uStack_146 = uVar12;
              uStack_145 = uVar13;
              uStack_144 = uVar14;
              uStack_143 = uVar15;
              uStack_142 = uVar16;
              uStack_141 = uVar17;
              uStack_140 = uVar18;
              uStack_13f = uVar19;
              uStack_13e = uVar20;
              uStack_13d = uVar21;
              uStack_13c = uVar22;
              uStack_13b = uVar23;
              uStack_13a = uVar24;
              uStack_139 = uVar25;
              if ((((slot_type *)uVar27)[local_1b0 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar52]) == 0) break;
              lVar51 = local_1d8 + uVar49;
              uVar49 = uVar49 + 1;
              uVar50 = lVar51 + 1U & local_1e0;
            } while (uVar49 <= local_1e0);
            lVar51 = 0;
LAB_0037fa21:
            if (lVar51 == 0) {
              if (local_40 < local_48) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_160,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_70,(arrays_type *)local_68,local_1c0,local_208,&local_230);
                local_40 = local_40 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_160,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_70,local_208,&local_230);
              }
              local_160.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                             NetSymbol::createImplicit(local_1f8,local_200,local_1f0);
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitSymbols,
                         (Symbol **)&local_160);
            }
            pTVar53 = (TransparentMemberSymbol *)&(pTVar53->super_Symbol).name;
          } while (pTVar53 != (TransparentMemberSymbol *)pSVar55);
        }
        args_00 = local_1d0;
        this = local_220;
        if ((TransparentMemberSymbol *)local_1a0._0_8_ !=
            (TransparentMemberSymbol *)(local_1a0 + 0x18)) {
          operator_delete((void *)local_1a0._0_8_);
          args_00 = local_1d0;
          this = local_220;
        }
      }
    }
    else if (args_00->kind == Specparam) {
      local_1a0._0_8_ =
           BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                     (&local_1c8->super_BumpAllocator,args_00);
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitSymbols,(Symbol **)local_1a0)
      ;
    }
    args_00 = args_00->nextInScope;
  } while( true );
}

Assistant:

SpecifyBlockSymbol& SpecifyBlockSymbol::fromSyntax(const Scope& scope,
                                                   const SpecifyBlockSyntax& syntax,
                                                   SmallVector<const Symbol*>& implicitSymbols) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SpecifyBlockSymbol>(comp, syntax.specify.location());
    result->setSyntax(syntax);

    for (auto member : syntax.items)
        result->addMembers(*member);

    SmallSet<std::string_view, 8> implicitNetNames;

    for (auto member = result->getFirstMember(); member; member = member->getNextSibling()) {
        if (member->kind == SymbolKind::Specparam) {
            // specparams inside specify blocks get visibility in the parent scope as well.
            implicitSymbols.push_back(comp.emplace<TransparentMemberSymbol>(*member));
        }
        else if (member->kind == SymbolKind::SystemTimingCheck) {
            // some system timing checks can create implicit nets
            auto& timingCheck = member->as<SystemTimingCheckSymbol>();
            createImplicitNets(timingCheck, timingCheck.def, scope, implicitSymbols,
                               implicitNetNames);
        }
    }

    return *result;
}